

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O2

void __thiscall slang::SourceSnippet::~SourceSnippet(SourceSnippet *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  std::__cxx11::string::~string((string *)&this->highlightLine);
  std::__cxx11::string::~string((string *)&this->snippetLine);
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::cleanup
            (&(this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>,
             in_RSI);
  SmallVectorBase<int>::cleanup((SmallVectorBase<int> *)this,in_RSI);
  return;
}

Assistant:

SourceSnippet(std::string_view sourceLine, uint32_t tabStop) {
        SLANG_ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }